

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::setTipStates
          (BeagleCPUImpl<double,_1,_0> *this,int tipIndex,int *inStates)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int *local_28;
  
  iVar4 = -5;
  if (-1 < tipIndex) {
    iVar4 = -5;
    if (tipIndex < this->kTipCount) {
      local_28 = (int *)0x0;
      posix_memalign(&local_28,0x20,(long)this->kPaddedPatternCount << 2);
      this->gTipStates[(uint)tipIndex] = local_28;
      iVar2 = this->kPatternCount;
      if (0 < iVar2) {
        lVar3 = 0;
        piVar1 = this->gTipStates[(uint)tipIndex];
        do {
          iVar4 = this->kStateCount;
          if (inStates[lVar3] < this->kStateCount) {
            iVar4 = inStates[lVar3];
          }
          piVar1[lVar3] = iVar4;
          lVar3 = lVar3 + 1;
          iVar2 = this->kPatternCount;
        } while (lVar3 < iVar2);
      }
      iVar4 = 0;
      if (iVar2 < this->kPaddedPatternCount) {
        lVar3 = (long)iVar2;
        piVar1 = this->gTipStates[(uint)tipIndex];
        iVar2 = this->kStateCount;
        do {
          piVar1[lVar3] = iVar2;
          lVar3 = lVar3 + 1;
        } while (lVar3 < this->kPaddedPatternCount);
      }
    }
  }
  return iVar4;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setTipStates(int tipIndex,
                                const int* inStates) {
    if (tipIndex < 0 || tipIndex >= kTipCount)
        return BEAGLE_ERROR_OUT_OF_RANGE;
    gTipStates[tipIndex] = (int*) mallocAligned(sizeof(int) * kPaddedPatternCount);
    // TODO: What if this throws a memory full error?
    for (int j = 0; j < kPatternCount; j++) {
        gTipStates[tipIndex][j] = (inStates[j] < kStateCount ? inStates[j] : kStateCount);
    }
    for (int j = kPatternCount; j < kPaddedPatternCount; j++) {
        gTipStates[tipIndex][j] = kStateCount;
    }

    return BEAGLE_SUCCESS;
}